

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O1

void __thiscall Logger::createLogFile(Logger *this)

{
  char cVar1;
  ostream *poVar2;
  string local_38;
  
  getCurrentLogFileName_abi_cxx11_(&local_38,this);
  std::__cxx11::string::operator=((string *)&this->logFileName,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  std::ofstream::open((string *)&this->logfp,(_Ios_Openmode)&this->logFileName);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to create log file: ",0x1b);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->logFileName)._M_dataplus._M_p,
                        (this->logFileName)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  return;
}

Assistant:

inline void createLogFile()  // 创建日志文件
    {
#if defined(_WIN32) || defined(_WIN64)
        logFileName = getCurrentLogFileName();
        // 创建并打开日志文件
        logFileHandle = CreateFile(logFileName.c_str(), GENERIC_WRITE, FILE_SHARE_READ, NULL, CREATE_ALWAYS, FILE_ATTRIBUTE_NORMAL, NULL);
        if (logFileHandle == INVALID_HANDLE_VALUE) {
            std::cerr << "Failed to create log file: " << logFileName << std::endl;
            return;
        }
        // 设置文件指针到文件末尾
        SetFilePointer(logFileHandle, 0, NULL, FILE_END);
#else
        logFileName = getCurrentLogFileName();
        // 创建并打开日志文件
        logfp.open(logFileName, std::ios::app);
        if (!logfp.is_open()) {
            std::cerr << "Failed to create log file: " << logFileName << std::endl;
        }
#endif
    }